

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaCompressorSimd.cpp
# Opt level: O3

void anon_unknown.dwarf_143d90::dumpBuffer(SimdAlignedBuffer64f *buffer)

{
  ostream *poVar1;
  int j;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  
  lVar3 = 0;
  lVar4 = 0;
  do {
    lVar2 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>
                         ((double)*(float *)((long)buffer->_buffer + lVar2 * 4 + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"  ",2);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x20;
  } while (lVar4 != 8);
  return;
}

Assistant:

void
dumpBuffer (const SimdAlignedBuffer64f& buffer)
{
    for (int i = 0; i < 8; ++i)
    {
        for (int j = 0; j < 8; ++j)
        {
            cout << buffer._buffer[i * 8 + j] << "  ";
        }
        cout << endl;
    }
}